

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O1

ambiguous_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::
operator<<(ambiguous_param *__return_storage_ptr__,
          specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error> *this,
          basic_cstring<const_char> *val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  string local_40;
  
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
            (&local_40,(utils *)val,val);
  std::__cxx11::string::_M_append((char *)(this + 0x18),(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__param_error_001cbb58;
  uVar1 = *(undefined4 *)(this + 0xc);
  uVar2 = *(undefined4 *)(this + 0x10);
  uVar3 = *(undefined4 *)(this + 0x14);
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_begin = *(undefined4 *)(this + 8);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>)
           .super_input_error.super_param_error.param_name.m_begin + 4) = uVar1;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_end = uVar2;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>)
           .super_input_error.super_param_error.param_name.m_end + 4) = uVar3;
  (__return_storage_ptr__->
  super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>).
  super_input_error.super_param_error.msg._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                 ).super_input_error.super_param_error.msg.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(__return_storage_ptr__->
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              ).super_input_error.super_param_error.msg,*(long *)(this + 0x18),
             *(long *)(this + 0x20) + *(long *)(this + 0x18));
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__ambiguous_param_001cce88;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector(&__return_storage_ptr__->m_amb_candidates,
           (vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
            *)(this + 0x38));
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }